

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.c
# Opt level: O2

void abuf_add_template(autobuf *out,abuf_template_storage *storage,_Bool keys)

{
  char *pcVar1;
  size_t sVar2;
  size_t len;
  ulong uVar3;
  size_t *psVar4;
  size_t sVar5;
  
  psVar4 = &storage->indices[0].end;
  sVar5 = 0;
  for (uVar3 = 0; uVar3 < storage->count; uVar3 = uVar3 + 1) {
    len = psVar4[-1] - sVar5;
    if (sVar5 <= psVar4[-1] && len != 0) {
      abuf_memcpy(out,storage->format + sVar5,len);
    }
    pcVar1 = (&((abuf_template_storage_entry *)(psVar4 + -2))->data->key)[!keys];
    if (pcVar1 != (char *)0x0) {
      abuf_puts(out,pcVar1);
    }
    sVar5 = *psVar4;
    psVar4 = psVar4 + 3;
  }
  pcVar1 = storage->format;
  sVar2 = strlen(pcVar1);
  if (sVar5 < sVar2) {
    abuf_puts(out,pcVar1 + sVar5);
    return;
  }
  return;
}

Assistant:

void
abuf_add_template(struct autobuf *out, struct abuf_template_storage *storage, bool keys) {
  struct abuf_template_storage_entry *entry;
  size_t i, last = 0;
  const char *value;

  for (i = 0; i < storage->count; i++) {
    entry = &storage->indices[i];

    /* copy prefix text */
    if (last < entry->start) {
      abuf_memcpy(out, &storage->format[last], entry->start - last);
    }

    if (keys) {
      value = entry->data->key;
    }
    else {
      value = entry->data->value;
    }
    if (value) {
      abuf_puts(out, value);
    }
    last = entry->end;
  }

  if (last < strlen(storage->format)) {
    abuf_puts(out, &storage->format[last]);
  }
}